

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_stats.cpp
# Opt level: O3

BaseStatistics * duckdb::ArrayStats::GetChildStats(BaseStatistics *stats)

{
  StatisticsType SVar1;
  InternalException *this;
  string local_40;
  
  SVar1 = BaseStatistics::GetStatsType(&stats->type);
  if (SVar1 == ARRAY_STATS) {
    return (stats->child_stats).
           super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
           .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"ArrayStats::GetChildStats called on stats that is not a array","")
  ;
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BaseStatistics &ArrayStats::GetChildStats(BaseStatistics &stats) {
	if (stats.GetStatsType() != StatisticsType::ARRAY_STATS) {
		throw InternalException("ArrayStats::GetChildStats called on stats that is not a array");
	}
	D_ASSERT(stats.child_stats);
	return stats.child_stats[0];
}